

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O2

token * __thiscall libchars::commands::find_pval(commands *this,token *position)

{
  token *ptVar1;
  token **pptVar2;
  
  if (this->cmd == (command *)0x0) {
    return (token *)0x0;
  }
  pptVar2 = &position->next;
  if (position == (token *)0x0) {
    pptVar2 = &this->t_par;
  }
  while( true ) {
    ptVar1 = *pptVar2;
    if (ptVar1 == (token *)0x0) {
      return (token *)0x0;
    }
    if (ptVar1->ttype == VALUE) break;
    pptVar2 = &ptVar1->next;
  }
  return ptVar1;
}

Assistant:

token *commands::find_pval(token *position)
    {
        if (cmd == NULL)
            return NULL;

        token *T = (position == NULL) ? t_par : position->next;
        while (T != NULL && T->ttype != token::VALUE)
            T = T->next;

        return T;
    }